

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O1

bool __thiscall
Pda::checkIfDouble(Pda *this,vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *v,Node *n)

{
  pointer ppNVar1;
  Node *this_00;
  size_t __n;
  bool bVar2;
  int iVar3;
  string *psVar4;
  string *psVar5;
  pointer ppNVar6;
  bool local_141;
  _Deque_base<char,_std::allocator<char>_> local_130;
  _Deque_iterator<char,_const_char_&,_const_char_*> local_e0;
  _Deque_iterator<char,_const_char_&,_const_char_*> local_c0;
  _Deque_iterator<char,_const_char_&,_const_char_*> local_a0;
  _Deque_base<char,_std::allocator<char>_> local_80;
  
  ppNVar6 = (v->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar1 = (v->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_141 = ppNVar6 != ppNVar1;
  if (local_141) {
    do {
      this_00 = *ppNVar6;
      Tjen::Node::getStack
                ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_130,this_00);
      Tjen::Node::getStack((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_80,n);
      if (local_130._M_impl.super__Deque_impl_data._M_start._M_last +
          (long)(local_130._M_impl.super__Deque_impl_data._M_finish._M_cur +
                ((((((ulong)((long)local_130._M_impl.super__Deque_impl_data._M_finish._M_node -
                            (long)local_130._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                   1) + (ulong)(local_130._M_impl.super__Deque_impl_data._M_finish._M_node ==
                               (_Map_pointer)0x0)) * 0x200 -
                 (long)local_130._M_impl.super__Deque_impl_data._M_finish._M_first) -
                (long)local_130._M_impl.super__Deque_impl_data._M_start._M_cur)) ==
          local_80._M_impl.super__Deque_impl_data._M_start._M_last +
          (long)(local_80._M_impl.super__Deque_impl_data._M_finish._M_cur +
                ((((((ulong)((long)local_80._M_impl.super__Deque_impl_data._M_finish._M_node -
                            (long)local_80._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                   1) + (ulong)(local_80._M_impl.super__Deque_impl_data._M_finish._M_node ==
                               (_Map_pointer)0x0)) * 0x200 -
                 (long)local_80._M_impl.super__Deque_impl_data._M_finish._M_first) -
                (long)local_80._M_impl.super__Deque_impl_data._M_start._M_cur))) {
        local_c0._M_cur = local_130._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_c0._M_first = local_130._M_impl.super__Deque_impl_data._M_start._M_first;
        local_c0._M_last = local_130._M_impl.super__Deque_impl_data._M_start._M_last;
        local_c0._M_node = local_130._M_impl.super__Deque_impl_data._M_start._M_node;
        local_e0._M_cur = local_130._M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_e0._M_first = local_130._M_impl.super__Deque_impl_data._M_finish._M_first;
        local_e0._M_last = local_130._M_impl.super__Deque_impl_data._M_finish._M_last;
        local_e0._M_node = local_130._M_impl.super__Deque_impl_data._M_finish._M_node;
        local_a0._M_cur = local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_a0._M_first = local_80._M_impl.super__Deque_impl_data._M_start._M_first;
        local_a0._M_last = local_80._M_impl.super__Deque_impl_data._M_start._M_last;
        local_a0._M_node = local_80._M_impl.super__Deque_impl_data._M_start._M_node;
        bVar2 = std::
                __equal_dit<char,char_const&,char_const*,std::_Deque_iterator<char,char_const&,char_const*>>
                          (&local_c0,&local_e0,&local_a0);
        if (!bVar2) goto LAB_00133c2c;
        psVar4 = Tjen::Node::getName_abi_cxx11_(this_00);
        psVar5 = Tjen::Node::getName_abi_cxx11_(n);
        __n = psVar4->_M_string_length;
        if (__n != psVar5->_M_string_length) goto LAB_00133c2c;
        if (__n == 0) {
          std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_80);
          std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_130);
          return local_141;
        }
        iVar3 = bcmp((psVar4->_M_dataplus)._M_p,(psVar5->_M_dataplus)._M_p,__n);
        std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_80);
        std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_130);
        if (iVar3 == 0) {
          return local_141;
        }
      }
      else {
LAB_00133c2c:
        std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_80);
        std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_130);
      }
      ppNVar6 = ppNVar6 + 1;
      local_141 = ppNVar6 != ppNVar1;
    } while (local_141);
  }
  return local_141;
}

Assistant:

bool Pda::checkIfDouble(std::vector<Tjen::Node *> &v, Tjen::Node *n) {
    for(Tjen::Node* state : v){
        if(state->getStack() == n->getStack() && state->getName() == n->getName()){
            return true;
        }

    }
        return false;
}